

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

DataType deqp::gles31::Functional::FboTestUtil::getFragmentOutputType(TextureFormat *format)

{
  TextureChannelClass TVar1;
  TextureFormat *format_local;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    format_local._4_4_ = TYPE_FLOAT_VEC4;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    format_local._4_4_ = TYPE_INT_VEC4;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    format_local._4_4_ = TYPE_UINT_VEC4;
    break;
  default:
    format_local._4_4_ = TYPE_LAST;
  }
  return format_local._4_4_;
}

Assistant:

glu::DataType getFragmentOutputType (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return glu::TYPE_FLOAT_VEC4;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return glu::TYPE_UINT_VEC4;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return glu::TYPE_INT_VEC4;

		default:
			DE_FATAL("Unknown format");
			return glu::TYPE_LAST;
	}
}